

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

void __thiscall QMakeEvaluator::~QMakeEvaluator(QMakeEvaluator *this)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)((long)&this->m_tmp[1].d.d + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_tmp3).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_tmp2).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_tmp1).d);
  std::__cxx11::
  _List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::_M_clear
            ((_List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
              *)&this->m_valuemapStack);
  QArrayDataPointer<ProString>::~QArrayDataPointer
            ((QArrayDataPointer<ProString> *)&this->m_returnValue);
  ProFunctionDefs::~ProFunctionDefs(&this->m_functionDefs);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&this->m_dirSep);
  QExplicitlySharedDataPointer<QMakeFeatureRoots>::~QExplicitlySharedDataPointer
            (&this->m_featureRoots);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_mkspecPaths).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_qmakefeatures).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->m_qmakepath).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_buildRoot).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_sourceRoot).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_stashfile).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_cachefile).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_conffile).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_superfile).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_qmakespecName).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_qmakespec).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_outputDir).d);
  QArrayDataPointer<ProString>::~QArrayDataPointer
            ((QArrayDataPointer<ProString> *)&this->m_extraConfigs);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&(this->m_extraVars).d);
  QArrayDataPointer<ProFile_*>::~QArrayDataPointer
            ((QArrayDataPointer<ProFile_*> *)&this->m_profileStack);
  QArrayDataPointer<QMakeEvaluator::Location>::~QArrayDataPointer
            ((QArrayDataPointer<QMakeEvaluator::Location> *)&this->m_locationStack);
  return;
}

Assistant:

QMakeEvaluator::~QMakeEvaluator()
{
}